

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O3

curi_status
parse_IPv4address(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  ulong uVar1;
  curi_status cVar2;
  char *pcVar3;
  curi_status cVar4;
  curi_settings *pcVar5;
  
  cVar2 = parse_dec_octet(uri,len,offset,settings,userData);
  if (cVar2 == curi_status_success) {
    uVar1 = *offset;
    pcVar3 = uri + uVar1;
    if (len <= uVar1) {
      pcVar3 = "";
    }
    *offset = uVar1 + 1;
    cVar4 = curi_status_error;
    cVar2 = cVar4;
    if ((*(char *)&((curi_settings *)pcVar3)->allocate == '.') &&
       (cVar2 = parse_dec_octet(uri,len,offset,(curi_settings *)pcVar3,userData),
       cVar2 == curi_status_success)) {
      uVar1 = *offset;
      pcVar3 = uri + uVar1;
      if (len <= uVar1) {
        pcVar3 = "";
      }
      *offset = uVar1 + 1;
      cVar2 = cVar4;
      if ((*(char *)&((curi_settings *)pcVar3)->allocate == '.') &&
         (cVar2 = parse_dec_octet(uri,len,offset,(curi_settings *)pcVar3,userData),
         cVar2 == curi_status_success)) {
        uVar1 = *offset;
        pcVar5 = (curi_settings *)"";
        if (uVar1 < len) {
          pcVar5 = (curi_settings *)(uri + uVar1);
        }
        *offset = uVar1 + 1;
        cVar2 = cVar4;
        if (*(char *)&pcVar5->allocate == '.') {
          cVar2 = parse_dec_octet(uri,len,offset,(curi_settings *)(uri + uVar1),userData);
          return cVar2;
        }
      }
    }
  }
  return cVar2;
}

Assistant:

static curi_status parse_IPv4address(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // IPv4address = dec-octet "." dec-octet "." dec-octet "." dec-octet
    curi_status status = curi_status_success;

    if (status == curi_status_success)
        status = parse_dec_octet(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_char('.', uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_dec_octet(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_char('.', uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_dec_octet(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_char('.', uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_dec_octet(uri, len, offset, settings, userData);

    return status;
}